

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Filter::Filter(Filter *this,Severity severity)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->tag_filter_)._M_t._M_impl.super__Rb_tree_header;
  (this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  add_filter(this,severity);
  return;
}

Assistant:

Filter(Severity severity) { add_filter(severity); }